

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomVisitor.hpp
# Opt level: O3

void __thiscall
OpenMD::DefaultAtomVisitor::DefaultAtomVisitor(DefaultAtomVisitor *this,SimInfo *info)

{
  BaseAtomVisitor::BaseAtomVisitor(&this->super_BaseAtomVisitor,info);
  (this->super_BaseAtomVisitor).super_BaseVisitor._vptr_BaseVisitor =
       (_func_int **)&PTR__BaseVisitor_002bb010;
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_BaseAtomVisitor).super_BaseVisitor.visitorName,0,
             (char *)(this->super_BaseAtomVisitor).super_BaseVisitor.visitorName._M_string_length,
             0x2571a0);
  return;
}

Assistant:

DefaultAtomVisitor(SimInfo* info) : BaseAtomVisitor(info) {
      visitorName = "DefaultAtomVisitor";
    }